

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void S_StopMusic(bool force)

{
  undefined7 in_register_00000039;
  
  if ((((int)CONCAT71(in_register_00000039,force) != 0) || (PlayList == (FPlayList *)0x0)) &&
     (*(int *)(mus_playing.name.Chars + -0xc) != 0)) {
    if (mus_playing.handle != (MusInfo *)0x0) {
      if (MusicPaused == '\x01') {
        (*(mus_playing.handle)->_vptr_MusInfo[6])();
      }
      (*(mus_playing.handle)->_vptr_MusInfo[7])();
      if (mus_playing.handle != (MusInfo *)0x0) {
        (*(mus_playing.handle)->_vptr_MusInfo[1])();
      }
      mus_playing.handle = (MusInfo *)0x0;
    }
    FString::operator=(&LastSong,&mus_playing.name);
    FString::operator=(&mus_playing.name,(char *)"");
    return;
  }
  return;
}

Assistant:

void S_StopMusic (bool force)
{
	// [RH] Don't stop if a playlist is active.
	if ((force || PlayList == NULL) && !mus_playing.name.IsEmpty())
	{
		if (mus_playing.handle != NULL)
		{
			if (MusicPaused)
				mus_playing.handle->Resume();

			mus_playing.handle->Stop();
			delete mus_playing.handle;
			mus_playing.handle = NULL;
		}
		LastSong = mus_playing.name;
		mus_playing.name = "";
	}
}